

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextClassifier.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CoreMLModels::TextClassifier::MergeFrom
          (TextClassifier *this,TextClassifier *from)

{
  uint32_t uVar1;
  ClassLabelsCase CVar2;
  LogMessage *other;
  ulong uVar3;
  TextClassifier *pTVar4;
  Arena *pAVar5;
  string *psVar6;
  StringVector *this_00;
  StringVector *from_00;
  LogFinisher local_85;
  uint32_t cached_has_bits;
  byte local_71;
  LogMessage local_70;
  TextClassifier *local_38;
  TextClassifier *from_local;
  TextClassifier *this_local;
  TextClassifier *local_20;
  string *local_18;
  TextClassifier *local_10;
  
  local_71 = 0;
  local_38 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/TextClassifier.pb.cc"
               ,0x15f);
    local_71 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_70,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_85,other);
  }
  if ((local_71 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_70);
  }
  _internal_language_abi_cxx11_(local_38);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pTVar4 = (TextClassifier *)_internal_language_abi_cxx11_(local_38);
    this_local = pTVar4;
    local_20 = this;
    pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->language_,pTVar4,pAVar5);
  }
  _internal_modelparameterdata_abi_cxx11_(local_38);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    psVar6 = _internal_modelparameterdata_abi_cxx11_(local_38);
    local_18 = psVar6;
    local_10 = this;
    pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->modelparameterdata_,psVar6,pAVar5);
  }
  uVar1 = _internal_revision(local_38);
  if (uVar1 != 0) {
    uVar1 = _internal_revision(local_38);
    _internal_set_revision(this,uVar1);
  }
  CVar2 = ClassLabels_case(local_38);
  if ((CVar2 != CLASSLABELS_NOT_SET) && (CVar2 == kStringClassLabels)) {
    this_00 = _internal_mutable_stringclasslabels(this);
    from_00 = _internal_stringclasslabels(local_38);
    StringVector::MergeFrom(this_00,from_00);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_38->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void TextClassifier::MergeFrom(const TextClassifier& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CoreMLModels.TextClassifier)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (!from._internal_language().empty()) {
    _internal_set_language(from._internal_language());
  }
  if (!from._internal_modelparameterdata().empty()) {
    _internal_set_modelparameterdata(from._internal_modelparameterdata());
  }
  if (from._internal_revision() != 0) {
    _internal_set_revision(from._internal_revision());
  }
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      _internal_mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from._internal_stringclasslabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}